

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O2

void __thiscall
cfd::core::Address::CalculateP2WSH(Address *this,ByteData256 *hash_data,string *bech32_hrp)

{
  int iVar1;
  NetType_conflict NVar2;
  CfdException *this_00;
  char *wally_string;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes;
  int ret;
  undefined1 local_b0 [32];
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> prefix_list;
  vector<unsigned_char,_std::allocator<unsigned_char>_> segwit_data;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  char *output;
  string human_code;
  
  ByteData256::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,hash_data);
  segwit_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  segwit_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  segwit_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  human_code._M_dataplus._M_p._0_1_ = (undefined1)this->witness_ver_;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&segwit_data,(uchar *)&human_code);
  human_code._M_dataplus._M_p._0_1_ =
       (char)local_58._M_impl.super__Vector_impl_data._M_finish._0_4_ -
       (char)local_58._M_impl.super__Vector_impl_data._M_start._0_4_;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&segwit_data,(uchar *)&human_code);
  ::std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((uchar *)CONCAT44(local_58._M_impl.super__Vector_impl_data._M_start._4_4_,
                               local_58._M_impl.super__Vector_impl_data._M_start._0_4_),
             (uchar *)CONCAT44(local_58._M_impl.super__Vector_impl_data._M_finish._4_4_,
                               local_58._M_impl.super__Vector_impl_data._M_finish._0_4_),
             &segwit_data);
  ::std::__cxx11::string::string((string *)&human_code,(string *)bech32_hrp);
  if ((human_code._M_string_length == 0) && ((uint)this->type_ < 3)) {
    GetBitcoinAddressFormatList();
    AddressFormatData::GetBech32Hrp_abi_cxx11_
              ((string *)local_b0,
               prefix_list.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start + (uint)this->type_);
    ::std::__cxx11::string::operator=((string *)&human_code,(string *)local_b0);
    ::std::__cxx11::string::~string((string *)local_b0);
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&this->format_data_,
                (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(prefix_list.
                    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                    ._M_impl.super__Vector_impl_data._M_start + (uint)this->type_));
    NVar2 = AddressFormatData::GetNetType(&this->format_data_);
    this->type_ = NVar2;
    ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector(&prefix_list);
  }
  output = (char *)0x0;
  ret = wally_addr_segwit_from_bytes
                  (segwit_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)segwit_data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)segwit_data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                   (char *)CONCAT71(human_code._M_dataplus._M_p._1_7_,
                                    human_code._M_dataplus._M_p._0_1_),0,&output);
  if (ret == 0) {
    WallyUtil::ConvertStringAndFree_abi_cxx11_((string *)local_b0,(WallyUtil *)output,wally_string);
    ::std::__cxx11::string::operator=((string *)&this->address_,(string *)local_b0);
    ::std::__cxx11::string::~string((string *)local_b0);
    ::std::__cxx11::string::~string((string *)&human_code);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&segwit_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_58);
    return;
  }
  local_b0._0_8_ = "cfdcore_address.cpp";
  local_b0._8_4_ = 0x435;
  local_b0._16_8_ = "CalculateP2WSH";
  logger::warn<int&>((CfdSourceLocation *)local_b0,"wally_addr_segwit_from_bytes error. ret={}.",
                     &ret);
  prefix_list.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x5e1474;
  prefix_list.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x437;
  prefix_list.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_5f4e9b;
  StringUtil::ByteToString_abi_cxx11_((string *)local_b0,(StringUtil *)&segwit_data,bytes);
  logger::info<std::__cxx11::string>
            ((CfdSourceLocation *)&prefix_list,"input hash={}",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  ::std::__cxx11::string::~string((string *)local_b0);
  iVar1 = ret;
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  if (iVar1 == -2) {
    ::std::__cxx11::string::string
              ((string *)local_b0,"Segwit-address create error.",(allocator *)&prefix_list);
    CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_b0);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::__cxx11::string::string
            ((string *)local_b0,"Segwit-address create error.",(allocator *)&prefix_list);
  CfdException::CfdException(this_00,kCfdInternalError,(string *)local_b0);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Address::CalculateP2WSH(
    const ByteData256& hash_data, const std::string& bech32_hrp) {
  const std::vector<uint8_t>& script_hash_byte = hash_data.GetBytes();
  std::vector<uint8_t> segwit_data;

  // 0byte目にwitness_version, 1byte目にhashサイズ
  segwit_data.push_back(witness_ver_);
  segwit_data.push_back(static_cast<uint8_t>(script_hash_byte.size()));
  std::copy(
      script_hash_byte.begin(), script_hash_byte.end(),
      std::back_inserter(segwit_data));

  std::string human_code = bech32_hrp;
  if (human_code.empty() && (kMainnet <= type_) && (type_ <= kRegtest)) {
    auto prefix_list = GetBitcoinAddressFormatList();
    human_code = prefix_list[type_].GetBech32Hrp();
    format_data_ = prefix_list[type_];
    SetNetType(format_data_);
  }
  char* output = NULL;
  // segwit
  int ret = wally_addr_segwit_from_bytes(
      segwit_data.data(), segwit_data.size(), human_code.data(), 0, &output);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_addr_segwit_from_bytes error. ret={}.", ret);
    info(
        CFD_LOG_SOURCE, "input hash={}",
        StringUtil::ByteToString(segwit_data));
    if (ret == WALLY_EINVAL) {
      throw CfdException(
          kCfdIllegalArgumentError, "Segwit-address create error.");
    } else {
      throw CfdException(kCfdInternalError, "Segwit-address create error.");
    }
  }

  address_ = WallyUtil::ConvertStringAndFree(output);
}